

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

void vkt::SpirVAssembly::(anonymous_namespace)::fillRandomScalars<int,bool(*)(long)>
               (Random *rnd,int minValue,int maxValue,void *dst,int numValues,
               _func_bool_long *filter,int offset)

{
  int iVar1;
  int ndx;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 200; lVar2 = lVar2 + 1) {
    do {
      iVar1 = de::Random::getInt(rnd,minValue,maxValue);
    } while (iVar1 == 0);
    *(int *)((long)dst + lVar2 * 4) = iVar1;
  }
  return;
}

Assistant:

static void fillRandomScalars (de::Random& rnd, T minValue, T maxValue, void* dst, int numValues, FilterT filter, int offset = 0)
{
	T* const typedPtr = (T*)dst;
	T value;
	for (int ndx = 0; ndx < numValues; ndx++)
	{
		do
			value = randomScalar<T>(rnd, minValue, maxValue);
		while (!filter(value));

		typedPtr[offset + ndx] = value;
	}
}